

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadEffectFloat(ColladaParser *this,ai_real *pFloat)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *c;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  cVar1 = (char)iVar2;
  do {
    if (cVar1 == '\0') {
      return;
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 1) {
      if (iVar3 != 1) {
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"float");
      if (iVar2 == 0) {
        c = GetTextContent(this);
        fast_atoreal_move<float>(c,pFloat,true);
        TestClosing(this,"float");
      }
      else {
        SkipElement(this);
      }
    }
    else if (iVar3 == 2) {
      return;
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar2;
  } while( true );
}

Assistant:

void ColladaParser::ReadEffectFloat(ai_real& pFloat)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("float"))
            {
                // text content contains a single floats
                const char* content = GetTextContent();
                content = fast_atoreal_move<ai_real>(content, pFloat);
                SkipSpacesAndLineEnd(&content);

                TestClosing("float");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}